

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

void vrna_exp_params_rescale(vrna_fold_compound_t *vc,double *mfe)

{
  vrna_mx_pf_t *pvVar1;
  FLT_OR_DBL *pFVar2;
  int iVar3;
  vrna_exp_param_t *pvVar4;
  FLT_OR_DBL *pFVar5;
  ulong uVar6;
  vrna_md_t *md_from;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  if (vc == (vrna_fold_compound_t *)0x0) {
    return;
  }
  pvVar4 = vc->exp_params;
  if (pvVar4 == (vrna_exp_param_t *)0x0) {
    if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
      pvVar4 = get_exp_params_ali(&vc->params->model_details,(vc->field_23).field_1.n_seq,-1.0);
    }
    else {
      if (vc->type != VRNA_FC_TYPE_SINGLE) {
        return;
      }
      pvVar4 = get_scaled_exp_params(&vc->params->model_details,-1.0);
    }
    vc->exp_params = pvVar4;
LAB_001248f2:
    if (pvVar4 == (vrna_exp_param_t *)0x0) {
      return;
    }
  }
  else {
    md_from = &vc->params->model_details;
    iVar3 = bcmp(md_from,&pvVar4->model_details,0x7e8);
    if (iVar3 != 0) {
      vrna_md_copy(&pvVar4->model_details,md_from);
      pvVar4 = vc->exp_params;
      goto LAB_001248f2;
    }
  }
  dVar9 = pvVar4->kT;
  if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
    dVar9 = dVar9 / (double)(vc->field_23).field_1.n_seq;
  }
  if (mfe == (double *)0x0) {
    dVar10 = pvVar4->pf_scale;
    if (1.0 <= dVar10) goto LAB_0012499d;
    dVar10 = (pvVar4->temperature + -37.0) * 7.27 + -185.0;
  }
  else {
    dVar10 = (*mfe * 1000.0) / (double)vc->length;
  }
  dVar10 = exp((-(pvVar4->model_details).sfact * dVar10) / dVar9);
  pvVar4->pf_scale = dVar10;
LAB_0012499d:
  if (dVar10 < 1.0) {
    pvVar4->pf_scale = 1.0;
  }
  pvVar1 = vc->exp_matrices;
  pvVar4 = vc->exp_params;
  if (pvVar4 != (vrna_exp_param_t *)0x0 && pvVar1 != (vrna_mx_pf_t *)0x0) {
    pFVar5 = pvVar1->scale;
    *pFVar5 = 1.0;
    pFVar5[1] = 1.0 / pvVar4->pf_scale;
    pFVar2 = pvVar1->expMLbase;
    *pFVar2 = 1.0;
    pFVar2[1] = pvVar4->expMLbase / pvVar4->pf_scale;
    if (1 < vc->length) {
      uVar7 = 2;
      do {
        uVar6 = uVar7 >> 1 & 0x7fffffff;
        pFVar5[uVar7] = pFVar5[uVar6] * pFVar5[(int)uVar7 - (int)uVar6];
        dVar9 = pow(pvVar4->expMLbase,(double)(int)uVar7);
        pFVar5 = pvVar1->scale;
        pvVar1->expMLbase[uVar7] = dVar9 * pFVar5[uVar7];
        bVar8 = uVar7 < vc->length;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_rescale(vrna_fold_compound_t  *vc,
                        double                *mfe)
{
  vrna_exp_param_t  *pf;
  double            e_per_nt, kT;
  vrna_md_t         *md;

  if (vc) {
    if (!vc->exp_params) {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:
          vc->exp_params = vrna_exp_params(&(vc->params->model_details));
          break;
        case VRNA_FC_TYPE_COMPARATIVE:
          vc->exp_params = vrna_exp_params_comparative(vc->n_seq, &(vc->params->model_details));
          break;
      }
    } else if (memcmp(&(vc->params->model_details),
                      &(vc->exp_params->model_details),
                      sizeof(vrna_md_t)) != 0) {
      /* make sure that model details are matching */
      (void)vrna_md_copy(&(vc->exp_params->model_details), &(vc->params->model_details));
      /* we probably need some mechanism to check whether DP matrices still match the new model settings! */
    }

    pf = vc->exp_params;
    if (pf) {
      kT  = pf->kT;
      md  = &(pf->model_details);

      if (vc->type == VRNA_FC_TYPE_COMPARATIVE)
        kT /= vc->n_seq;

      /* re-compute scaling factor if necessary */
      if ((mfe) || (pf->pf_scale < 1.)) {
        if (mfe)  /* use largest known Boltzmann factor for scaling */
          e_per_nt = *mfe * 1000. / vc->length;
        else      /* use mean energy for random sequences: 184.3*length cal for scaling */
          e_per_nt = -185 + (pf->temperature - 37.) * 7.27;

        /* apply user-defined scaling factor to allow scaling for unusually stable/unstable structure enembles */
        pf->pf_scale = exp(-(md->sfact * e_per_nt) / kT);
      }

      if (pf->pf_scale < 1.)
        pf->pf_scale = 1.;

      rescale_params(vc);
    }
  }
}